

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.cc
# Opt level: O2

void ipx::dump<int>(ostream *os,char *name,int value)

{
  ostream *poVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *text;
  allocator local_81;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  std::__cxx11::string::string((string *)&local_40,"info.",&local_81);
  std::operator+(&local_80,&local_40,name);
  Textline<std::__cxx11::string>(&local_60,(ipx *)&local_80,text);
  poVar1 = std::operator<<(os,(string *)&local_60);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,value);
  std::operator<<(poVar1,'\n');
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

static void dump(std::ostream& os, const char* name, T value) {
    os << Textline(std::string("info.")+name) << value << '\n';
}